

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_xor.cpp
# Opt level: O0

float meanLoss(Net *net,LabeledDataset *dataset)

{
  bool bVar1;
  float fVar2;
  LabeledData LVar3;
  Array *local_78;
  LabeledData sample;
  DatasetIterator __end1;
  DatasetIterator __begin1;
  LabeledDataset *__range1;
  int n;
  float total;
  LabeledDataset *dataset_local;
  Net *net_local;
  
  __range1._4_4_ = 0.0;
  __range1._0_4_ = 0;
  notch::core::LabeledDataset::begin((DatasetIterator *)&__end1.out_end,dataset);
  notch::core::LabeledDataset::end((DatasetIterator *)&sample.label,dataset);
  while( true ) {
    bVar1 = notch::core::LabeledDataset::DatasetIterator::operator!=
                      ((DatasetIterator *)&__end1.out_end,(DatasetIterator *)&sample.label);
    if (!bVar1) break;
    LVar3 = notch::core::LabeledDataset::DatasetIterator::operator*
                      ((DatasetIterator *)&__end1.out_end);
    local_78 = LVar3.data;
    sample.data = LVar3.label;
    fVar2 = notch::core::Net::loss(net,local_78,sample.data);
    __range1._4_4_ = fVar2 + __range1._4_4_;
    __range1._0_4_ = (int)__range1 + 1;
    notch::core::LabeledDataset::DatasetIterator::operator++((DatasetIterator *)&__end1.out_end);
  }
  return __range1._4_4_ / (float)(int)__range1;
}

Assistant:

float meanLoss(Net &net, LabeledDataset &dataset) {
    float total = 0.0;
    int n = 0;
    for (auto sample : dataset) {
        total += net.loss(sample.data, sample.label);
        n++;
    }
    return total / n;
}